

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O2

JavascriptString * __thiscall
Js::JavascriptString::ConcatDestructive_OneEmpty(JavascriptString *this,JavascriptString *pstRight)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  char16 *pcVar4;
  JavascriptString *pJVar5;
  uint lenLeft;
  char16_t *pcVar6;
  
  if (pstRight == (JavascriptString *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x1f5,"(pstRight)","pstRight");
    if (!bVar2) goto LAB_00bbadcd;
    *puVar3 = 0;
  }
  lenLeft = this->m_charLength;
  if (lenLeft == 0) {
    lenLeft = 0;
  }
  else if (pstRight->m_charLength != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x1f6,"(GetLength() == 0 || pstRight->GetLength() == 0)",
                                "GetLength() == 0 || pstRight->GetLength() == 0");
    if (!bVar2) goto LAB_00bbadcd;
    *puVar3 = 0;
    lenLeft = this->m_charLength;
  }
  StringProfiler::RecordConcatenation
            ((((((this->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr,lenLeft,pstRight->m_charLength,
             ConcatType_Unknown);
  bVar2 = Phases::IsEnabled((Phases *)&DAT_01453738,StringConcatPhase);
  if (bVar2) {
    pcVar6 = L"...";
    if ((pstRight->m_pszValue).ptr == (char16_t *)0x0) {
      pcVar4 = L"";
    }
    else {
      pcVar4 = GetString(pstRight);
      if (((pstRight->m_pszValue).ptr != (char16_t *)0x0) &&
         (pcVar6 = L"", 8 < pstRight->m_charLength)) {
        pcVar6 = L"...";
      }
    }
    Output::Print(L"JavascriptString::ConcatDestructive(\"%.8s%s\") - one side empty, using other side\n"
                  ,pcVar4,pcVar6);
    Output::Flush();
  }
  if (this->m_charLength == 0) {
    pJVar5 = CompoundString::GetImmutableOrScriptUnreferencedString(pstRight);
    return pJVar5;
  }
  pJVar5 = CompoundString::GetImmutableOrScriptUnreferencedString(this);
  if (pJVar5 != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x208,
                                "(CompoundString::GetImmutableOrScriptUnreferencedString(this) == this)"
                                ,
                                "CompoundString::GetImmutableOrScriptUnreferencedString(this) == this"
                               );
    if (!bVar2) {
LAB_00bbadcd:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return this;
}

Assistant:

JavascriptString* JavascriptString::ConcatDestructive_OneEmpty(JavascriptString* pstRight)
    {
        Assert(pstRight);
        Assert(GetLength() == 0 || pstRight->GetLength() == 0);

#ifdef PROFILE_STRINGS
        StringProfiler::RecordConcatenation(GetScriptContext(), GetLength(), pstRight->GetLength());
#endif
        if(PHASE_TRACE_StringConcat)
        {
            Output::Print(
                _u("JavascriptString::ConcatDestructive(\"%.8s%s\") - one side empty, using other side\n"),
                pstRight->IsFinalized() ? pstRight->GetString() : _u(""),
                !pstRight->IsFinalized() || pstRight->GetLength() > 8 ? _u("...") : _u(""));
            Output::Flush();
        }

        if(GetLength() == 0)
        {
            return CompoundString::GetImmutableOrScriptUnreferencedString(pstRight);
        }
        Assert(CompoundString::GetImmutableOrScriptUnreferencedString(this) == this);
        return this;
    }